

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::PassRunner::runPassOnFunction(PassRunner *this,Pass *pass,Function *func)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  ostream *poVar4;
  pointer pPVar5;
  pointer this_00;
  Fatal *pFVar6;
  byte local_3a9;
  char local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  Fatal local_378;
  WasmValidator local_1e9;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_1e8;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> instance;
  unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
  local_1d8;
  unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
  checker;
  stringstream local_1c0 [8];
  stringstream bodyBefore;
  ostream local_1b0 [379];
  byte local_35;
  int local_34;
  bool extraFunctionValidation;
  int passDebug;
  Function *local_20;
  Function *func_local;
  Pass *pass_local;
  PassRunner *this_local;
  
  local_20 = func;
  func_local = (Function *)pass;
  pass_local = (Pass *)this;
  uVar2 = (*pass->_vptr_Pass[4])();
  if ((uVar2 & 1) == 0) {
    __assert_fail("pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x3d2,"void wasm::PassRunner::runPassOnFunction(Pass *, Function *)");
  }
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&(this->options).passesToSkip,
                  (key_type *)&(func_local->super_Importable).super_Named.hasExplicitName);
  if (sVar3 == 0) {
    local_34 = getPassDebug();
    local_3a9 = 0;
    if ((local_34 == 2) && (local_3a9 = 0, ((this->options).validate & 1U) != 0)) {
      local_3a9 = std::__cxx11::string::empty();
      local_3a9 = local_3a9 ^ 0xff;
    }
    local_35 = local_3a9 & 1;
    std::__cxx11::stringstream::stringstream(local_1c0);
    if ((local_35 & 1) != 0) {
      poVar4 = std::operator<<(local_1b0,local_20->body);
      std::operator<<(poVar4,'\n');
    }
    std::
    unique_ptr<wasm::AfterEffectFunctionChecker,std::default_delete<wasm::AfterEffectFunctionChecker>>
    ::unique_ptr<std::default_delete<wasm::AfterEffectFunctionChecker>,void>
              ((unique_ptr<wasm::AfterEffectFunctionChecker,std::default_delete<wasm::AfterEffectFunctionChecker>>
                *)&local_1d8);
    if (local_34 != 0) {
      std::make_unique<wasm::AfterEffectFunctionChecker,wasm::Function*&>((Function **)&instance);
      std::
      unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
      ::operator=(&local_1d8,
                  (unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                   *)&instance);
      std::
      unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
      ::~unique_ptr((unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                     *)&instance);
    }
    (**(code **)((func_local->super_Importable).super_Named.name.super_IString.str._M_len + 0x28))
              (&local_1e8);
    pPVar5 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(&local_1e8);
    Pass::setPassRunner(pPVar5,this);
    pPVar5 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(&local_1e8);
    (*pPVar5->_vptr_Pass[3])(pPVar5,this->wasm,local_20);
    handleAfterEffects(this,(Pass *)func_local,local_20);
    if (local_34 != 0) {
      this_00 = std::
                unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                ::operator->(&local_1d8);
      AfterEffectFunctionChecker::check(this_00);
    }
    if (((local_35 & 1) != 0) &&
       (bVar1 = WasmValidator::validate(&local_1e9,local_20,this->wasm,0),
       ((bVar1 ^ 0xffU) & 1) != 0)) {
      Fatal::Fatal(&local_378);
      pFVar6 = Fatal::operator<<(&local_378,(char (*) [37])"Last nested function-parallel pass (");
      pFVar6 = Fatal::operator<<(pFVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&(func_local->super_Importable).super_Named.
                                            hasExplicitName);
      pFVar6 = Fatal::operator<<(pFVar6,(char (*) [32])") broke validation of function ");
      pFVar6 = Fatal::operator<<(pFVar6,(Name *)local_20);
      pFVar6 = Fatal::operator<<(pFVar6,(char (*) [37])". Here is the function body before:\n");
      std::__cxx11::stringstream::str();
      pFVar6 = Fatal::operator<<(pFVar6,&local_398);
      pFVar6 = Fatal::operator<<(pFVar6,(char (*) [23])"\n\nAnd here it is now:\n");
      pFVar6 = Fatal::operator<<(pFVar6,local_20->body);
      local_399 = '\n';
      Fatal::operator<<(pFVar6,&local_399);
      std::__cxx11::string::~string((string *)&local_398);
      Fatal::~Fatal(&local_378);
    }
    std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_1e8);
    std::
    unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
    ::~unique_ptr(&local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  else {
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->skippedPasses,
             (value_type *)&(func_local->super_Importable).super_Named.hasExplicitName);
  }
  return;
}

Assistant:

void PassRunner::runPassOnFunction(Pass* pass, Function* func) {
  assert(pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    skippedPasses.insert(pass->name);
    return;
  }

  auto passDebug = getPassDebug();

  // Add extra validation logic in pass-debug mode 2. The main logic in
  // PassRunner::run will work at the module level, and here for a function-
  // parallel pass we can do the same at the function level: we can print the
  // function before the pass, run the pass on the function, and then if it
  // fails to validate we can show an error and print the state right before the
  // pass broke it.
  //
  // Skip nameless passes for this. Anything without a name is an internal
  // component of some larger pass, and information about it won't be very
  // useful - leave it to the entire module to fail validation in that case.
  bool extraFunctionValidation =
    passDebug == 2 && options.validate && !pass->name.empty();
  std::stringstream bodyBefore;
  if (extraFunctionValidation) {
    bodyBefore << *func->body << '\n';
  }

  std::unique_ptr<AfterEffectFunctionChecker> checker;
  if (passDebug) {
    checker = std::make_unique<AfterEffectFunctionChecker>(func);
  }

  // Function-parallel passes get a new instance per function
  auto instance = pass->create();
  instance->setPassRunner(this);
  instance->runOnFunction(wasm, func);
  handleAfterEffects(pass, func);

  if (passDebug) {
    checker->check();
  }

  if (extraFunctionValidation) {
    if (!WasmValidator().validate(func, *wasm, WasmValidator::Minimal)) {
      Fatal() << "Last nested function-parallel pass (" << pass->name
              << ") broke validation of function " << func->name
              << ". Here is the function body before:\n"
              << bodyBefore.str() << "\n\nAnd here it is now:\n"
              << *func->body << '\n';
    }
  }
}